

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model_test.cc
# Opt level: O2

void __thiscall
NoiseModel_InitFailsWithInvalidBitdepth_Test::TestBody
          (NoiseModel_InitFailsWithInvalidBitdepth_Test *this)

{
  int iVar1;
  char *in_R9;
  uint uVar2;
  long lVar3;
  aom_noise_model_params_t params;
  aom_noise_model_params_t params_00;
  aom_noise_model_params_t params_01;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_330;
  AssertHelper local_328;
  AssertionResult gtest_ar_;
  string local_310;
  aom_noise_model_t model;
  
  for (lVar3 = 0; lVar3 != 0x21; lVar3 = lVar3 + 1) {
    uVar2 = (uint)lVar3;
    if ((uVar2 < 0xd) && ((0x1500U >> (uVar2 & 0x1f) & 1) != 0)) {
      params.bit_depth = (int)lVar3;
      params.use_highbd = (int)((ulong)lVar3 >> 0x20);
      params.shape = '\x01';
      params._1_3_ = 0;
      params.lag = 2;
      iVar1 = aom_noise_model_init(&model,params);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ = iVar1 != 0;
      if (!gtest_ar_.success_) {
        testing::Message::Message((Message *)&local_330);
        std::operator<<((ostream *)(local_330._M_head_impl + 0x10),"bit_depth: ");
        std::ostream::operator<<(local_330._M_head_impl + 0x10,uVar2);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_310,(internal *)&gtest_ar_,
                   (AssertionResult *)"aom_noise_model_init(&model, params)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_328,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                   ,0x15a,local_310._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_328,(Message *)&local_330);
        testing::internal::AssertHelper::~AssertHelper(&local_328);
        std::__cxx11::string::~string((string *)&local_310);
        if (local_330._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_330._M_head_impl + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      aom_noise_model_free(&model);
    }
    else {
      params_00.bit_depth = (int)lVar3;
      params_00.use_highbd = (int)((ulong)lVar3 >> 0x20);
      params_00.shape = '\x01';
      params_00._1_3_ = 0;
      params_00.lag = 2;
      iVar1 = aom_noise_model_init(&model,params_00);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ = iVar1 == 0;
      if (!gtest_ar_.success_) {
        testing::Message::Message((Message *)&local_330);
        std::operator<<((ostream *)(local_330._M_head_impl + 0x10),"bit_depth: ");
        std::ostream::operator<<(local_330._M_head_impl + 0x10,uVar2);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_310,(internal *)&gtest_ar_,
                   (AssertionResult *)"aom_noise_model_init(&model, params)","true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_328,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                   ,0x15d,local_310._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_328,(Message *)&local_330);
        testing::internal::AssertHelper::~AssertHelper(&local_328);
        std::__cxx11::string::~string((string *)&local_310);
        if (local_330._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_330._M_head_impl + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
    }
  }
  params_01.bit_depth = 0x7fffffff;
  params_01.use_highbd = 0;
  params_01.shape = '\x01';
  params_01._1_3_ = 0;
  params_01.lag = 2;
  iVar1 = aom_noise_model_init(&model,params_01);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = iVar1 == 0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_330);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_310,(internal *)&gtest_ar_,
               (AssertionResult *)"aom_noise_model_init(&model, params)","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
               ,0x161,local_310._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_328,(Message *)&local_330);
    testing::internal::AssertHelper::~AssertHelper(&local_328);
    std::__cxx11::string::~string((string *)&local_310);
    if (local_330._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_330._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

TEST(NoiseModel, InitFailsWithInvalidBitdepth) {
  aom_noise_model_t model;
  aom_noise_model_params_t params = { AOM_NOISE_SHAPE_SQUARE, 2, 8, 0 };
  for (int i = 0; i <= 32; ++i) {
    params.bit_depth = i;
    if (i == 8 || i == 10 || i == 12) {
      EXPECT_TRUE(aom_noise_model_init(&model, params)) << "bit_depth: " << i;
      aom_noise_model_free(&model);
    } else {
      EXPECT_FALSE(aom_noise_model_init(&model, params)) << "bit_depth: " << i;
    }
  }
  params.bit_depth = INT_MAX;
  EXPECT_FALSE(aom_noise_model_init(&model, params));
}